

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O3

void * going_calloc(size_t nmemb,size_t size)

{
  void *extraout_RAX;
  void *pvVar1;
  
  pvVar1 = calloc(nmemb,size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  going_calloc();
  pvVar1 = malloc(nmemb);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  going_malloc();
  free((void *)nmemb);
  return extraout_RAX;
}

Assistant:

void *going_calloc(size_t nmemb, size_t size)
{
	void *ptr = calloc(nmemb, size);
	if(NULL == ptr){
		log_err("going_calloc failed.");
		exit(-1);
	}
	return ptr;
}